

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderImageLoadStoreTests.cpp
# Opt level: O0

TextureType deqp::gles31::Functional::textureLayerType(TextureType entireTextureType)

{
  undefined4 local_c;
  TextureType entireTextureType_local;
  
  local_c = entireTextureType;
  if (entireTextureType != TEXTURETYPE_2D) {
    if (entireTextureType - TEXTURETYPE_CUBE < 3) {
      local_c = TEXTURETYPE_2D;
    }
    else if (entireTextureType != TEXTURETYPE_BUFFER) {
      local_c = TEXTURETYPE_LAST;
    }
  }
  return local_c;
}

Assistant:

static inline TextureType textureLayerType (TextureType entireTextureType)
{
	switch (entireTextureType)
	{
		// Single-layer types.
		// \note Fallthrough.
		case TEXTURETYPE_BUFFER:
		case TEXTURETYPE_2D:
			return entireTextureType;

		// Multi-layer types with 2d layers.
		case TEXTURETYPE_3D:
		case TEXTURETYPE_CUBE:
		case TEXTURETYPE_2D_ARRAY:
			return TEXTURETYPE_2D;

		default:
			DE_ASSERT(false);
			return TEXTURETYPE_LAST;
	}
}